

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::character_in_range::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,character_in_range *this,location *param_1)

{
  int c;
  int c_00;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"from `",(allocator<char> *)&local_30);
  show_char_abi_cxx11_(&local_30,(detail *)(ulong)this->from_,c);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,"` to `");
  show_char_abi_cxx11_(&local_30,(detail *)(ulong)this->to_,c_00);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,"`");
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_in_range::expected_chars(location&) const
{
    std::string expected("from `");
    expected += show_char(from_);
    expected += "` to `";
    expected += show_char(to_);
    expected += "`";
    return expected;
}